

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O3

void __thiscall kratos::Simulator::process_stmt(Simulator *this,SwitchStmt *switch_,Var *var)

{
  _Rb_tree_header *p_Var1;
  Var *var_00;
  long lVar2;
  _Base_ptr p_Var3;
  StmtBlock *pSVar4;
  int iVar5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  mapped_type *pmVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  optional<unsigned_long> oVar10;
  key_type local_58;
  Var *local_40;
  Simulator *local_38;
  
  var_00 = (switch_->target_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var9 = (switch_->target_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  local_40 = var;
  if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
  }
  local_38 = this;
  oVar10 = get_value_(this,var_00);
  p_Var1 = &(switch_->body_)._M_t._M_impl.super__Rb_tree_header;
  if (((undefined1  [16])
       oVar10.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    p_Var3 = (switch_->body_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var3 == (_Base_ptr)0x0) {
      return;
    }
    do {
      p_Var7 = p_Var3;
      p_Var3 = p_Var7->_M_left;
    } while (p_Var7->_M_left != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var7 == p_Var1) {
      return;
    }
    if (*(long *)(p_Var7 + 1) != 0) {
      return;
    }
    local_58.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_58.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pmVar8 = std::
             map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
             ::at(&switch_->body_,&local_58);
    pSVar4 = &((pmVar8->super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->super_StmtBlock;
    p_Var9 = (pmVar8->super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
      }
    }
    if (local_58.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    process_stmt(local_38,pSVar4,local_40);
  }
  else {
    for (p_Var6 = (switch_->body_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != p_Var1;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      if ((*(long *)(p_Var6 + 1) != 0) &&
         (lVar2 = *(long *)(*(long *)(p_Var6 + 1) + 0x270),
         iVar5 = (*(var_00->super_IRNode)._vptr_IRNode[7])(var_00),
         oVar10.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload ==
         (ulong)(lVar2 << ((byte)iVar5 & 0x3f)) >> ((byte)iVar5 & 0x3f))) {
        process_stmt(local_38,(StmtBlock *)p_Var6[1]._M_left,local_40);
        return;
      }
    }
    p_Var3 = (switch_->body_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var3 == (_Base_ptr)0x0) {
      return;
    }
    do {
      p_Var7 = p_Var3;
      p_Var3 = p_Var7->_M_left;
    } while (p_Var7->_M_left != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var7 == p_Var1) {
      return;
    }
    if (*(long *)(p_Var7 + 1) != 0) {
      return;
    }
    local_58.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_58.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pmVar8 = std::
             map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
             ::at(&switch_->body_,&local_58);
    pSVar4 = &((pmVar8->super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->super_StmtBlock;
    p_Var9 = (pmVar8->super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
      }
    }
    if (local_58.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    process_stmt(local_38,pSVar4,local_40);
  }
  if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
  }
  return;
}

Assistant:

void Simulator::process_stmt(kratos::SwitchStmt *switch_, const Var *var) {
    auto *target = switch_->target().get();
    auto val = get_value_(target);
    auto const &body = switch_->body();
    if (!val) {
        // go to default case
        if (body.find(nullptr) != body.end()) {
            auto stmt = body.at(nullptr);
            process_stmt(stmt.get(), var);
        }
    } else {
        auto value = *val;
        for (auto const &[cond, stmt] : body) {
            // we compare bits
            if (!cond) continue;
            int64_t cond_val = cond->value();
            int64_t *v_p = &cond_val;
            uint64_t bits = *(reinterpret_cast<uint64_t *>(v_p));
            bits &= (0xFFFFFFFFFFFFFFFF >> target->width());
            if (value == bits) {
                process_stmt(stmt.get(), var);
                return;
            }
        }
        // default case
        if (body.find(nullptr) != body.end()) {
            auto stmt = body.at(nullptr);
            process_stmt(stmt.get(), var);
        }
    }
}